

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::Float::stExponent(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  double __x;
  int exp;
  int local_14;
  ulong *puVar3;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  puVar3 = (ulong *)CONCAT44(extraout_var_00,uVar2);
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 6) == 4) {
      uVar4 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
      __x = (double)(uVar4 >> 1 | (ulong)((uVar4 & 1) != 0) << 0x3f);
    }
    else {
      if (((uVar2 & 6) != 0) || ((uint)(*puVar3 >> 0x2a) != 0x22)) {
        iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
        return iVar1;
      }
      if ((*puVar3 & 0xfffffc0000000000) != 0x880000000000) {
        __assert_fail("isFloatOrInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
      }
      __x = (double)puVar3[1];
    }
  }
  else {
    __x = (double)((long)puVar3 >> 1);
  }
  frexp(__x,&local_14);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x16])(interpreter,(long)local_14);
  return iVar1;
}

Assistant:

int Float::stExponent(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto v = interpreter->getReceiver();
    if (!v.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fv = v.decodeFloatOrInt();
    int exp;
     frexp(fv, &exp);

    return interpreter->returnInteger(exp);
}